

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

Vec_Int_t * Acb_NtkFindSupp(Acb_Ntk_t *p,Vec_Int_t *vRoots)

{
  int iVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  int i;
  Vec_Int_t *pVVar3;
  
  pVVar3 = vRoots;
  p_00 = Vec_IntAlloc(1000);
  Acb_NtkIncTravId(p);
  for (i = 0; i < vRoots->nSize; i = i + 1) {
    iVar1 = Vec_IntEntry(vRoots,i);
    iVar1 = Vec_IntEntry(&p->vCos,iVar1);
    piVar2 = Acb_ObjFanins(p,iVar1);
    pVVar3 = (Vec_Int_t *)(ulong)(uint)piVar2[1];
    Acb_NtkFindSupp_rec(p,piVar2[1],p_00);
  }
  Vec_IntSort(p_00,(int)pVVar3);
  return p_00;
}

Assistant:

Vec_Int_t * Acb_NtkFindSupp( Acb_Ntk_t * p, Vec_Int_t * vRoots )
{
    int i, iObj;
    Vec_Int_t * vSupp  = Vec_IntAlloc( 1000 );
    Acb_NtkIncTravId( p );
    Acb_NtkForEachCoDriverVec( vRoots, p, iObj, i )
        Acb_NtkFindSupp_rec( p, iObj, vSupp );
    Vec_IntSort( vSupp, 0 );
    //Vec_IntPrint( vSupp );
    return vSupp;
}